

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O3

int WebPPictureAllocYUVA(WebPPicture *picture)

{
  WebPEncCSP WVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint8_t *puVar5;
  long lVar6;
  uint uVar7;
  WebPEncodingError error;
  long lVar8;
  long lVar9;
  int iVar10;
  
  WVar1 = picture->colorspace;
  uVar2 = picture->width;
  iVar4 = picture->height;
  lVar8 = (long)iVar4;
  iVar3 = WebPValidatePicture(picture);
  if (iVar3 == 0) {
    return 0;
  }
  WebPSafeFree(picture->memory_);
  picture->memory_ = (void *)0x0;
  picture->y = (uint8_t *)0x0;
  picture->u = (uint8_t *)0x0;
  picture->v = (uint8_t *)0x0;
  picture->y_stride = 0;
  picture->uv_stride = 0;
  *(undefined8 *)&picture->uv_stride = 0;
  *(undefined8 *)((long)&picture->a + 4) = 0;
  iVar3 = (int)((long)(int)uVar2 + 1U >> 1);
  iVar10 = (int)(lVar8 + 1U >> 1);
  if ((iVar10 < 1 || (iVar4 < 1 || (int)uVar2 < 1)) || iVar3 < 1) {
    error = VP8_ENC_ERROR_BAD_DIMENSION;
  }
  else {
    uVar7 = (int)(WVar1 << 0x1d) >> 0x1f & uVar2;
    lVar9 = (int)uVar2 * lVar8;
    lVar6 = (long)iVar10 * (long)iVar3;
    lVar8 = (int)uVar7 * lVar8;
    puVar5 = (uint8_t *)WebPSafeMalloc(lVar8 + lVar9 + lVar6 * 2,1);
    if (puVar5 != (uint8_t *)0x0) {
      picture->memory_ = puVar5;
      picture->y_stride = uVar2;
      picture->uv_stride = iVar3;
      picture->a_stride = uVar7;
      picture->y = puVar5;
      puVar5 = puVar5 + lVar9;
      picture->u = puVar5;
      picture->v = puVar5 + lVar6;
      if (lVar8 == 0) {
        return 1;
      }
      picture->a = puVar5 + lVar6 + lVar6;
      return 1;
    }
    error = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  iVar4 = WebPEncodingSetError(picture,error);
  return iVar4;
}

Assistant:

int WebPPictureAllocYUVA(WebPPicture* const picture) {
  const int has_alpha = (int)picture->colorspace & WEBP_CSP_ALPHA_BIT;
  const int width = picture->width;
  const int height = picture->height;
  const int y_stride = width;
  const int uv_width = (int)(((int64_t)width + 1) >> 1);
  const int uv_height = (int)(((int64_t)height + 1) >> 1);
  const int uv_stride = uv_width;
  int a_width, a_stride;
  uint64_t y_size, uv_size, a_size, total_size;
  uint8_t* mem;

  if (!WebPValidatePicture(picture)) return 0;

  WebPSafeFree(picture->memory_);
  WebPPictureResetBufferYUVA(picture);

  // alpha
  a_width = has_alpha ? width : 0;
  a_stride = a_width;
  y_size = (uint64_t)y_stride * height;
  uv_size = (uint64_t)uv_stride * uv_height;
  a_size =  (uint64_t)a_stride * height;

  total_size = y_size + a_size + 2 * uv_size;

  // Security and validation checks
  if (width <= 0 || height <= 0 ||           // luma/alpha param error
      uv_width <= 0 || uv_height <= 0) {     // u/v param error
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
  }
  // allocate a new buffer.
  mem = (uint8_t*)WebPSafeMalloc(total_size, sizeof(*mem));
  if (mem == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }

  // From now on, we're in the clear, we can no longer fail...
  picture->memory_ = (void*)mem;
  picture->y_stride  = y_stride;
  picture->uv_stride = uv_stride;
  picture->a_stride  = a_stride;

  // TODO(skal): we could align the y/u/v planes and adjust stride.
  picture->y = mem;
  mem += y_size;

  picture->u = mem;
  mem += uv_size;
  picture->v = mem;
  mem += uv_size;

  if (a_size > 0) {
    picture->a = mem;
    mem += a_size;
  }
  (void)mem;  // makes the static analyzer happy
  return 1;
}